

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiViewportP *pIVar3;
  ImGuiContext *g;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar2 = GImGui->NavWindow, pIVar2 != (ImGuiWindow *)0x0)) {
    auVar5._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    pIVar3 = *(GImGui->Viewports).Data;
    IVar4 = pIVar2->NavRectRel[GImGui->NavLayer].Min;
    fVar8 = IVar4.x;
    IVar1 = pIVar2->NavRectRel[GImGui->NavLayer].Max;
    fVar9 = IVar1.y;
    auVar5._4_4_ = (GImGui->Style).FramePadding.y;
    auVar5._8_8_ = 0;
    auVar6._4_4_ = fVar9 - IVar4.y;
    auVar6._0_4_ = IVar1.x - fVar8;
    auVar6._8_8_ = 0;
    auVar6 = minps(auVar5,auVar6);
    auVar7._0_4_ = (pIVar2->Pos).x + fVar8 + auVar6._0_4_;
    auVar7._4_4_ = (pIVar2->Pos).y + (fVar9 - auVar6._4_4_);
    auVar7._8_4_ = auVar6._8_4_ + 0.0 + 0.0;
    auVar7._12_4_ = auVar6._12_4_ + 0.0 + 0.0;
    IVar4 = (pIVar3->super_ImGuiViewport).Pos;
    fVar8 = IVar4.x;
    fVar9 = IVar4.y;
    IVar4 = (pIVar3->super_ImGuiViewport).Size;
    auVar10._0_4_ = IVar4.x + fVar8;
    auVar10._4_4_ = IVar4.y + fVar9;
    auVar10._8_8_ = 0;
    auVar6 = minps(auVar10,auVar7);
    IVar4.x = (float)(int)(float)(~-(uint)(auVar7._0_4_ < fVar8) & auVar6._0_4_ |
                                 (uint)fVar8 & -(uint)(auVar7._0_4_ < fVar8));
    IVar4.y = (float)(int)(float)(~-(uint)(auVar7._4_4_ < fVar9) & auVar6._4_4_ |
                                 (uint)fVar9 & -(uint)(auVar7._4_4_ < fVar9));
    return IVar4;
  }
  if ((-256000.0 <= (GImGui->IO).MousePos.x) && (-256000.0 <= (GImGui->IO).MousePos.y)) {
    return (GImGui->IO).MousePos;
  }
  return GImGui->LastValidMousePos;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}